

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

double __thiscall r_exec::View::update_sln(View *this,double low,double high)

{
  float fVar1;
  float fVar2;
  double dVar3;
  Atom local_2c [4];
  double local_28;
  double local_20;
  
  local_28 = high;
  local_20 = low;
  if ((this->sln_changes != 0) && ((this->acc_sln != 0.0 || (NAN(this->acc_sln))))) {
    fVar1 = (float)r_code::Atom::asFloat();
    fVar1 = fVar1 + this->acc_sln / (float)this->sln_changes;
    fVar2 = 0.0;
    if ((0.0 <= fVar1) && (fVar2 = fVar1, 1.0 < fVar1)) {
      fVar2 = 1.0;
    }
    r_code::Atom::Float(fVar2);
    r_code::Atom::operator=((Atom *)&(this->super_View).field_0x34,local_2c);
    r_code::Atom::~Atom(local_2c);
  }
  this->acc_sln = 0.0;
  this->sln_changes = 0;
  fVar2 = (float)r_code::Atom::asFloat();
  dVar3 = (double)fVar2;
  if (local_20 <= dVar3) {
    this->periods_at_low_sln = 0;
    if (dVar3 <= local_28) {
      this->periods_at_high_sln = 0;
    }
    else {
      this->periods_at_high_sln = this->periods_at_high_sln + 1;
    }
  }
  else {
    this->periods_at_low_sln = this->periods_at_low_sln + 1;
  }
  return dVar3;
}

Assistant:

double View::update_sln(double low, double high)
{
    if (sln_changes > 0 && acc_sln != 0) {
        double new_sln = get_sln() + acc_sln / sln_changes;

        if (new_sln < 0) {
            new_sln = 0;
        } else if (new_sln > 1) {
            new_sln = 1;
        }

        code(VIEW_SLN) = r_code::Atom::Float(new_sln);
    }

    acc_sln = 0;
    sln_changes = 0;
    double sln = get_sln();

    if (sln < low) {
        ++periods_at_low_sln;
    } else {
        periods_at_low_sln = 0;

        if (sln > high) {
            ++periods_at_high_sln;
        } else {
            periods_at_high_sln = 0;
        }
    }

    return sln;
}